

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *mtctx)

{
  size_t code;
  uint uVar1;
  uint uVar2;
  ZSTDMT_jobDescription *pZVar3;
  ulong local_58;
  ulong local_50;
  size_t flushed;
  size_t produced;
  size_t cResult;
  ZSTDMT_jobDescription *jobPtr;
  uint wJobID;
  uint jobID;
  size_t toFlush;
  ZSTDMT_CCtx *mtctx_local;
  
  uVar1 = mtctx->doneJobID;
  if (mtctx->nextJobID < uVar1) {
    __assert_fail("jobID <= mtctx->nextJobID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4ece,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
  }
  if (uVar1 == mtctx->nextJobID) {
    mtctx_local = (ZSTDMT_CCtx *)0x0;
  }
  else {
    uVar1 = uVar1 & mtctx->jobIDMask;
    pZVar3 = mtctx->jobs + uVar1;
    pthread_mutex_lock((pthread_mutex_t *)&pZVar3->job_mutex);
    code = pZVar3->cSize;
    uVar2 = ZSTD_isError(code);
    local_50 = code;
    if (uVar2 != 0) {
      local_50 = 0;
    }
    uVar2 = ZSTD_isError(code);
    if (uVar2 == 0) {
      local_58 = pZVar3->dstFlushed;
    }
    else {
      local_58 = 0;
    }
    if (local_50 < local_58) {
      __assert_fail("flushed <= produced",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4ed8,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    if ((pZVar3->src).size < pZVar3->consumed) {
      __assert_fail("jobPtr->consumed <= jobPtr->src.size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4ed9,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    mtctx_local = (ZSTDMT_CCtx *)(local_50 - local_58);
    if ((mtctx_local == (ZSTDMT_CCtx *)0x0) && ((pZVar3->src).size <= pZVar3->consumed)) {
      __assert_fail("jobPtr->consumed < jobPtr->src.size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4ee1,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar1].job_mutex);
  }
  return (size_t)mtctx_local;
}

Assistant:

size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx* mtctx)
{
    size_t toFlush;
    unsigned const jobID = mtctx->doneJobID;
    assert(jobID <= mtctx->nextJobID);
    if (jobID == mtctx->nextJobID) return 0;   /* no active job => nothing to flush */

    /* look into oldest non-fully-flushed job */
    {   unsigned const wJobID = jobID & mtctx->jobIDMask;
        ZSTDMT_jobDescription* const jobPtr = &mtctx->jobs[wJobID];
        ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
        {   size_t const cResult = jobPtr->cSize;
            size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
            size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
            assert(flushed <= produced);
            assert(jobPtr->consumed <= jobPtr->src.size);
            toFlush = produced - flushed;
            /* if toFlush==0, nothing is available to flush.
             * However, jobID is expected to still be active:
             * if jobID was already completed and fully flushed,
             * ZSTDMT_flushProduced() should have already moved onto next job.
             * Therefore, some input has not yet been consumed. */
            if (toFlush==0) {
                assert(jobPtr->consumed < jobPtr->src.size);
            }
        }
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
    }

    return toFlush;
}